

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_perform(Curl_easy *data,_Bool *connected,_Bool *dophase_done)

{
  _Bool _Var1;
  FTP *ftp;
  CURLcode result;
  _Bool *dophase_done_local;
  _Bool *connected_local;
  Curl_easy *data_local;
  
  if ((*(ushort *)&(data->req).field_0xbb >> 0xc & 1) != 0) {
    ((data->req).p.file)->fd = 1;
  }
  *dophase_done = false;
  data_local._4_4_ = ftp_state_quote(data,true,'\f');
  if (data_local._4_4_ == CURLE_OK) {
    data_local._4_4_ = ftp_multi_statemach(data,dophase_done);
    _Var1 = Curl_conn_is_connected(data->conn,1);
    *connected = _Var1;
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      Curl_infof(data,"ftp_perform ends with SECONDARY: %d",(ulong)(*connected & 1));
    }
  }
  return data_local._4_4_;
}

Assistant:

static
CURLcode ftp_perform(struct Curl_easy *data,
                     bool *connected,  /* connect status after PASV / PORT */
                     bool *dophase_done)
{
  /* this is FTP and no proxy */
  CURLcode result = CURLE_OK;

  DEBUGF(infof(data, "DO phase starts"));

  if(data->req.no_body) {
    /* requested no body means no transfer... */
    struct FTP *ftp = data->req.p.ftp;
    ftp->transfer = PPTRANSFER_INFO;
  }

  *dophase_done = FALSE; /* not done yet */

  /* start the first command in the DO phase */
  result = ftp_state_quote(data, TRUE, FTP_QUOTE);
  if(result)
    return result;

  /* run the state-machine */
  result = ftp_multi_statemach(data, dophase_done);

  *connected = Curl_conn_is_connected(data->conn, SECONDARYSOCKET);

  infof(data, "ftp_perform ends with SECONDARY: %d", *connected);

  if(*dophase_done) {
    DEBUGF(infof(data, "DO phase is complete1"));
  }

  return result;
}